

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureSpecialCases.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::PreProcessTexSpecialCases(GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  GMM_PLATFORM_INFO *pGVar5;
  SKU_FEATURE_TABLE *pSVar6;
  GMM_TEXTURE_CALC *pGVar7;
  uint local_b0;
  uint local_a4;
  uint32_t local_a0;
  uint local_94;
  uint32_t local_88;
  uint32_t local_84;
  uint32_t local_80;
  uint local_7c;
  uint local_78;
  uint local_70;
  uint8_t HZ_DepthRows;
  uint32_t HZ_VAlign;
  uint32_t HZ_HAlign;
  uint32_t Z_HeightL;
  uint32_t QPitch;
  uint32_t NumSamples;
  uint32_t i;
  uint32_t hL;
  uint32_t h1;
  uint32_t h0;
  uint32_t Z_Depth;
  uint32_t Z_Height;
  uint32_t Z_Width;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_STATUS Status;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  pPlatform._4_4_ = GMM_SUCCESS;
  pGVar5 = GmmGetPlatformInfo(this->pGmmLibContext);
  if ((((((ulong)(pTexInfo->Flags).Gpu >> 1 & 1) != 0) ||
       (((ulong)(pTexInfo->Flags).Gpu >> 0xf & 1) != 0)) ||
      (((ulong)(pTexInfo->Flags).Gpu >> 10 & 1) != 0)) ||
     ((((ulong)(pTexInfo->Flags).Gpu >> 0x1d & 1) != 0 ||
      (((ulong)(pTexInfo->Flags).Gpu >> 0x10 & 1) != 0)))) {
    if (((ulong)(pTexInfo->Flags).Gpu >> 10 & 1) == 0) {
      if ((((ulong)(pTexInfo->Flags).Gpu >> 1 & 1) == 0) &&
         (((ulong)(pTexInfo->Flags).Gpu >> 0xf & 1) == 0)) {
        if (((ulong)(pTexInfo->Flags).Gpu >> 0x1d & 1) == 0) {
          if ((((ulong)(pTexInfo->Flags).Gpu >> 0x10 & 1) != 0) &&
             (((ulong)(pTexInfo->Flags).Gpu >> 0x25 & 1) != 0)) {
            (pTexInfo->Flags).Gpu =
                 (anon_struct_8_45_9b07292e_for_Gpu)
                 ((ulong)(pTexInfo->Flags).Gpu & 0xfffff7ffffffffff | 0x80000000000);
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xfffffffffff7ffff | 0x80000);
          }
        }
        else if ((pTexInfo->BaseWidth == 0) || (pTexInfo->BaseHeight == 0)) {
          pPlatform._4_4_ = GMM_ERROR;
        }
        else {
          pSVar6 = Context::GetSkuTable(this->pGmmLibContext);
          if ((*(ushort *)&pSVar6->field_0 >> 6 & 1) != 0) {
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xfffffffffff7ffff);
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xfffffff7ffffffff);
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xffffffdfffffffff);
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xfffffffbffffffff);
            pSVar6 = Context::GetSkuTable(this->pGmmLibContext);
            if ((*(ushort *)&pSVar6->field_0 >> 6 & 1) == 0) {
              (pTexInfo->Flags).Info =
                   (anon_struct_8_44_94931171_for_Info)
                   ((ulong)(pTexInfo->Flags).Info & 0xfffff7ffffffffff);
            }
            else {
              (pTexInfo->Flags).Info =
                   (anon_struct_8_44_94931171_for_Info)
                   ((ulong)(pTexInfo->Flags).Info & 0xffffffefffffffff);
            }
            pSVar6 = Context::GetSkuTable(this->pGmmLibContext);
            if ((*(ushort *)&pSVar6->field_0 >> 6 & 1) == 0) {
              (pTexInfo->Flags).Info =
                   (anon_struct_8_44_94931171_for_Info)
                   ((ulong)(pTexInfo->Flags).Info & 0xffffefffffffffff);
            }
            else {
              (pTexInfo->Flags).Info =
                   (anon_struct_8_44_94931171_for_Info)
                   ((ulong)(pTexInfo->Flags).Info & 0xffffffbfffffffff);
            }
            if (((int)(pGVar5->Platform).eRenderCoreFamily < 0xb) ||
               (0xf < (int)(pGVar5->Platform).eRenderCoreFamily)) {
              pSVar6 = Context::GetSkuTable(this->pGmmLibContext);
              if ((*(ushort *)&pSVar6->field_0 >> 6 & 1) == 0) {
                (pTexInfo->Flags).Info =
                     (anon_struct_8_44_94931171_for_Info)
                     ((ulong)(pTexInfo->Flags).Info & 0xfffff7ffffffffff | 0x80000000000);
              }
              else {
                (pTexInfo->Flags).Info =
                     (anon_struct_8_44_94931171_for_Info)
                     ((ulong)(pTexInfo->Flags).Info & 0xffffffefffffffff | 0x1000000000);
              }
            }
            else {
              (pTexInfo->Flags).Info =
                   (anon_struct_8_44_94931171_for_Info)
                   ((ulong)(pTexInfo->Flags).Info & 0xfffffffbffffffff | 0x400000000);
            }
          }
        }
      }
      else {
        pGVar7 = Context::GetTextureCalc(this->pGmmLibContext);
        pPlatform._4_4_ = (*pGVar7->_vptr_GmmTextureCalc[0x1d])(pGVar7,pTexInfo);
        if (((ulong)(pTexInfo->Flags).Gpu >> 0x2b & 1) == 0) {
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xfffffffffff7ffff);
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xfffffffbffffffff);
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xfffffff7ffffffff);
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xffffffdfffffffff);
          pSVar6 = Context::GetSkuTable(this->pGmmLibContext);
          if ((*(ushort *)&pSVar6->field_0 >> 6 & 1) == 0) {
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xffffefffffffffff);
          }
          else {
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xffffffbfffffffff);
          }
          pSVar6 = Context::GetSkuTable(this->pGmmLibContext);
          if ((*(ushort *)&pSVar6->field_0 >> 6 & 1) == 0) {
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xfffff7ffffffffff | 0x80000000000);
          }
          else {
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xffffffefffffffff | 0x1000000000);
          }
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xffffffffdfffffff);
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xffffffffffefffff);
        }
      }
    }
    else {
      if ((((pTexInfo->BaseWidth != 0) && (pTexInfo->BaseWidth <= (pGVar5->HiZ).MaxWidth)) &&
          (pTexInfo->BaseHeight != 0)) && ((ulong)pTexInfo->BaseHeight <= (pGVar5->HiZ).MaxHeight))
      {
        if (pTexInfo->Type == RESOURCE_3D) {
          local_70 = (pGVar5->HiZ).MaxDepth;
        }
        else {
          local_70 = 1;
        }
        if (pTexInfo->Depth <= local_70) {
          if (pTexInfo->Type == RESOURCE_3D) {
            local_78 = 1;
          }
          else {
            if (pTexInfo->Type == RESOURCE_CUBE) {
              local_7c = (pGVar5->HiZ).MaxArraySize / 6;
            }
            else {
              local_7c = (pGVar5->HiZ).MaxArraySize;
            }
            local_78 = local_7c;
          }
          if ((pTexInfo->ArraySize <= local_78) &&
             (((int)(pGVar5->Platform).eRenderCoreFamily < 0xc ||
              ((pTexInfo->Type != RESOURCE_1D && (pTexInfo->Type != RESOURCE_3D)))))) {
            uVar3 = pTexInfo->BaseHeight;
            if ((pTexInfo->Type == RESOURCE_1D) || (pTexInfo->Type == RESOURCE_2D)) {
              if (pTexInfo->ArraySize < 2) {
                local_80 = 1;
              }
              else {
                local_80 = pTexInfo->ArraySize;
              }
              h1 = local_80;
            }
            else if (pTexInfo->Type == RESOURCE_3D) {
              h1 = pTexInfo->Depth;
            }
            else if (pTexInfo->Type == RESOURCE_CUBE) {
              if (pTexInfo->ArraySize < 2) {
                local_84 = 1;
              }
              else {
                local_84 = pTexInfo->ArraySize;
              }
              h1 = local_84 * 6;
            }
            else {
              h1 = 0;
            }
            bVar1 = pGVar5->HiZPixelsPerByte;
            if ((int)(pGVar5->Platform).eRenderCoreFamily < 0xc) {
              local_88 = (pTexInfo->MSAA).NumSamples;
            }
            else {
              local_88 = 1;
            }
            uVar2 = ExpandWidth(this,(uint32_t)pTexInfo->BaseWidth,0x10,local_88);
            pTexInfo->BaseWidth = (ulong)uVar2;
            local_a4 = ExpandHeight(this,uVar3,8,local_88);
            uVar3 = (*this->_vptr_GmmTextureCalc[0x19])(this,pTexInfo,1);
            local_a0 = ExpandHeight(this,uVar3,8,local_88);
            if ((int)(pGVar5->Platform).eRenderCoreFamily < 0xb) {
              if (pTexInfo->Type == RESOURCE_3D) {
                HZ_VAlign = 0;
                for (QPitch = 0; QPitch <= pTexInfo->MaxLod; QPitch = QPitch + 1) {
                  uVar2 = ExpandHeight(this,uVar3 >> ((byte)QPitch & 0x1f),8,local_88);
                  uVar4 = GFX_2_TO_POWER_OF(QPitch);
                  if (h1 / uVar4 == 0) {
                    local_b0 = 1;
                  }
                  else {
                    uVar4 = GFX_2_TO_POWER_OF(QPitch);
                    local_b0 = h1 / uVar4;
                  }
                  HZ_VAlign = uVar2 * local_b0 + HZ_VAlign;
                }
                pTexInfo->BaseHeight = HZ_VAlign >> 1;
              }
              else {
                pTexInfo->BaseHeight = ((local_a4 + local_a0 + 0x60) * h1 >> 1) + 7 & 0xfffffff8;
              }
              pTexInfo->ArraySize = 1;
            }
            else {
              if (pTexInfo->Type == RESOURCE_3D) {
                HZ_VAlign = 0;
                for (QPitch = 0; QPitch <= pTexInfo->MaxLod; QPitch = QPitch + 1) {
                  uVar3 = (*this->_vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)QPitch);
                  uVar3 = ExpandHeight(this,uVar3,8,local_88);
                  uVar2 = GFX_2_TO_POWER_OF(QPitch);
                  if (h1 / uVar2 == 0) {
                    local_94 = 1;
                  }
                  else {
                    uVar2 = GFX_2_TO_POWER_OF(QPitch);
                    local_94 = h1 / uVar2;
                  }
                  HZ_VAlign = uVar3 * local_94 + HZ_VAlign;
                }
                pTexInfo->ArraySize = 0;
                pTexInfo->BaseHeight = HZ_VAlign >> 1;
              }
              else {
                HZ_VAlign = 0;
                for (QPitch = 2; QPitch <= pTexInfo->MaxLod; QPitch = QPitch + 1) {
                  uVar3 = (*this->_vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)QPitch);
                  uVar3 = ExpandHeight(this,uVar3,8,local_88);
                  HZ_VAlign = uVar3 + HZ_VAlign;
                }
                if (pTexInfo->MaxLod != 0) {
                  if (local_a0 <= HZ_VAlign) {
                    local_a0 = HZ_VAlign;
                  }
                  local_a4 = local_a4 + local_a0;
                }
                pTexInfo->ArraySize = h1;
                pTexInfo->BaseHeight = local_a4 / bVar1;
              }
              (pTexInfo->Alignment).HAlign = 0x10;
              (pTexInfo->Alignment).VAlign = 8 / bVar1;
            }
            pTexInfo->BitsPerPixel = 8;
            pTexInfo->Depth = 1;
            pTexInfo->Format = GMM_FORMAT_GENERIC_8BIT;
            pTexInfo->MaxLod = 0;
            (pTexInfo->MSAA).NumSamples = 1;
            (pTexInfo->MSAA).SamplePattern = GMM_MSAA_DISABLED;
            pTexInfo->Type = RESOURCE_2D;
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xfffffffffff7ffff);
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xfffffffbffffffff);
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xfffffff7ffffffff);
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xffffffdfffffffff);
            pSVar6 = Context::GetSkuTable(this->pGmmLibContext);
            if ((*(ushort *)&pSVar6->field_0 >> 6 & 1) == 0) {
              (pTexInfo->Flags).Info =
                   (anon_struct_8_44_94931171_for_Info)
                   ((ulong)(pTexInfo->Flags).Info & 0xffffefffffffffff);
            }
            else {
              (pTexInfo->Flags).Info =
                   (anon_struct_8_44_94931171_for_Info)
                   ((ulong)(pTexInfo->Flags).Info & 0xffffffbfffffffff);
            }
            pSVar6 = Context::GetSkuTable(this->pGmmLibContext);
            if ((*(ushort *)&pSVar6->field_0 >> 6 & 1) != 0) {
              (pTexInfo->Flags).Info =
                   (anon_struct_8_44_94931171_for_Info)
                   ((ulong)(pTexInfo->Flags).Info & 0xffffffefffffffff | 0x1000000000);
              return GMM_SUCCESS;
            }
            (pTexInfo->Flags).Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(pTexInfo->Flags).Info & 0xfffff7ffffffffff | 0x80000000000);
            return GMM_SUCCESS;
          }
        }
      }
      pPlatform._4_4_ = GMM_ERROR;
    }
  }
  return pPlatform._4_4_;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::PreProcessTexSpecialCases(GMM_TEXTURE_INFO *pTexInfo)
{
    GMM_STATUS               Status    = GMM_SUCCESS;
    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    if(!pTexInfo->Flags.Gpu.CCS &&
       !pTexInfo->Flags.Gpu.MCS &&
       !pTexInfo->Flags.Gpu.HiZ &&
       !pTexInfo->Flags.Gpu.SeparateStencil &&
       !pTexInfo->Flags.Gpu.MMC)
    {
        // Fast-out for non-special-cases.
    }
    else if(pTexInfo->Flags.Gpu.HiZ) // ######################################
    {
        // With HiZ surface creation, clients send the size/etc. parameters of
        // the associated Depth Buffer--and here we convert to the appropriate
        // HiZ creation parameters...

        if((pTexInfo->BaseWidth > 0) &&
           (pTexInfo->BaseWidth <= pPlatform->HiZ.MaxWidth) &&
           (pTexInfo->BaseHeight > 0) &&
           (pTexInfo->BaseHeight <= pPlatform->HiZ.MaxHeight) &&
           (pTexInfo->Depth <= ((pTexInfo->Type == RESOURCE_3D) ?
                                pPlatform->HiZ.MaxDepth :
                                1)) &&
           (pTexInfo->ArraySize <= ((pTexInfo->Type == RESOURCE_3D) ?
                                    1 :
                                    (pTexInfo->Type == RESOURCE_CUBE) ?
                                    pPlatform->HiZ.MaxArraySize / 6 :
                                    pPlatform->HiZ.MaxArraySize)) &&
           // SKL+ does not support HiZ surfaces for 1D and 3D surfaces
           ((GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) < IGFX_GEN9_CORE) ||
            (pTexInfo->Type != RESOURCE_1D && pTexInfo->Type != RESOURCE_3D)))
        {
            uint32_t Z_Width, Z_Height, Z_Depth;

            // Latch Z_[Width/Height/Depth]...
            Z_Width  = GFX_ULONG_CAST(pTexInfo->BaseWidth);
            Z_Height = pTexInfo->BaseHeight;
            if((pTexInfo->Type == RESOURCE_1D) ||
               (pTexInfo->Type == RESOURCE_2D))
            {
                Z_Depth = GFX_MAX(pTexInfo->ArraySize, 1);
            }
            else if(pTexInfo->Type == RESOURCE_3D)
            {
                Z_Depth = pTexInfo->Depth;
            }
            else if(pTexInfo->Type == RESOURCE_CUBE)
            {
                // HW doesn't allow HiZ cube arrays, but GMM is allowing because
                // clients will redescribe depth/HiZ cube arrays as 2D arrays.
                Z_Depth = 6 * GFX_MAX(pTexInfo->ArraySize, 1);
            }
            else
            {
                __GMM_ASSERT(0); // Illegal--Should have caught at upper IF check.
                Z_Depth = 0;
            }

            // HZ_[Width/Height/QPitch] Calculation...
            {
                uint32_t h0, h1, hL, i, NumSamples, QPitch, Z_HeightL;
                uint32_t HZ_HAlign = 16, HZ_VAlign = 8;
                uint8_t  HZ_DepthRows = pPlatform->HiZPixelsPerByte;

                // HZ operates in pixel space starting from SKL. So, it does not care
                // whether the depth buffer is in MSAA mode or not.
                NumSamples =
                (GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE) ?
                1 :
                pTexInfo->MSAA.NumSamples;

                pTexInfo->BaseWidth = ExpandWidth(Z_Width, HZ_HAlign, NumSamples);

                h0 = ExpandHeight(Z_Height, HZ_VAlign, NumSamples);

                Z_Height = GmmTexGetMipHeight(pTexInfo, 1);
                h1       = ExpandHeight(Z_Height, HZ_VAlign, NumSamples);

                if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN8_CORE)
                {
                    if(pTexInfo->Type == RESOURCE_3D)
                    {
                        for(i = 0, Z_HeightL = 0; i <= pTexInfo->MaxLod; i++)
                        {
                            Z_Height = GmmTexGetMipHeight(pTexInfo, i);
                            hL       = ExpandHeight(Z_Height, HZ_VAlign, NumSamples);
                            Z_HeightL += (hL * GFX_MAX(1, (Z_Depth / GFX_2_TO_POWER_OF(i))));
                        }

                        pTexInfo->ArraySize  = 0;
                        pTexInfo->BaseHeight = Z_HeightL / 2;
                    }
                    else
                    {
                        for(i = 2, Z_HeightL = 0; i <= pTexInfo->MaxLod; i++)
                        {
                            Z_Height = GmmTexGetMipHeight(pTexInfo, i);
                            Z_HeightL += ExpandHeight(Z_Height, HZ_VAlign, NumSamples);
                        }

                        QPitch =
                        (pTexInfo->MaxLod > 0) ?
                        (h0 + GFX_MAX(h1, Z_HeightL)) :
                        h0;
                        QPitch /= HZ_DepthRows;
                        pTexInfo->ArraySize  = Z_Depth;
                        pTexInfo->BaseHeight = QPitch;
                    }

                    pTexInfo->Alignment.HAlign = HZ_HAlign;
                    pTexInfo->Alignment.VAlign = HZ_VAlign / HZ_DepthRows;
                }
                else //if (GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN7_CORE)
                {
                    if(pTexInfo->Type == RESOURCE_3D)
                    {
                        for(i = 0, Z_HeightL = 0; i <= pTexInfo->MaxLod; i++)
                        {
                            hL = ExpandHeight(Z_Height >> i, HZ_VAlign, NumSamples);
                            Z_HeightL += (hL * GFX_MAX(1, (Z_Depth / GFX_2_TO_POWER_OF(i))));
                        }

                        pTexInfo->BaseHeight = Z_HeightL / 2;
                    }
                    else
                    {
                        QPitch = h0 + h1 + 12 * HZ_VAlign;

                        pTexInfo->BaseHeight = GFX_CEIL_DIV((QPitch * Z_Depth / 2), 8) * 8;
                    }

                    pTexInfo->ArraySize = 1;
                }
            }

            /// Native HZ Params //////////////////////////////////////////////////
            pTexInfo->BitsPerPixel       = 8;
            pTexInfo->Depth              = 1;
            pTexInfo->Format             = GMM_FORMAT_GENERIC_8BIT;
            pTexInfo->MaxLod             = 0;
            pTexInfo->MSAA.NumSamples    = 1;
            pTexInfo->MSAA.SamplePattern = GMM_MSAA_DISABLED;
            pTexInfo->Type               = RESOURCE_2D;

            // HiZ Always Tile-Y
            pTexInfo->Flags.Info.Linear  = 0;
            pTexInfo->Flags.Info.TiledW  = 0;
            pTexInfo->Flags.Info.TiledX  = 0;
            pTexInfo->Flags.Info.TiledYf = 0;
            GMM_SET_64KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
            GMM_SET_4KB_TILE(pTexInfo->Flags, 1, pGmmLibContext);

        }
        else
        {
            GMM_ASSERTDPF(0, "Illegal HiZ creation parameters!");
            Status = GMM_ERROR;
        }
    } // HiZ
    else if(pTexInfo->Flags.Gpu.CCS ||
            pTexInfo->Flags.Gpu.MCS) // ######################################
    {
        // With CCS surface creation, clients send height, width, depth, etc. of
        // the associated RenderTarget--and here we convert to the appropriate CCS
        // creation parameters...
        __GMM_ASSERT((!pGmmLibContext->GetSkuTable().FtrTileY ||
                      (pTexInfo->Flags.Info.Linear + pTexInfo->Flags.Info.TiledW + pTexInfo->Flags.Info.TiledX + pTexInfo->Flags.Info.TiledY)) == 1);

        __GMM_ASSERT((pGmmLibContext->GetSkuTable().FtrTileY || (pTexInfo->Flags.Info.Linear + pTexInfo->Flags.Info.Tile4 + pTexInfo->Flags.Info.Tile64)) == 1);

        __GMM_ASSERT((pTexInfo->MSAA.NumSamples == 1) || (pTexInfo->MSAA.NumSamples == 2) || (pTexInfo->MSAA.NumSamples == 4) ||
                     (pTexInfo->MSAA.NumSamples == 8) || (pTexInfo->MSAA.NumSamples == 16));

        Status = pGmmLibContext->GetTextureCalc()->MSAACCSUsage(pTexInfo);

        if(!pTexInfo->Flags.Gpu.__NonMsaaLinearCCS)
        {
            // CCS Always Tile-Y (Even for Non-MSAA FastClear.)
            pTexInfo->Flags.Info.Linear  = 0;
            pTexInfo->Flags.Info.TiledW  = 0;
            pTexInfo->Flags.Info.TiledX  = 0;
            pTexInfo->Flags.Info.TiledYf = 0;

            GMM_SET_64KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
            GMM_SET_4KB_TILE(pTexInfo->Flags, 1, pGmmLibContext);

            //Clear compression request in CCS
            pTexInfo->Flags.Info.RenderCompressed = 0;
            pTexInfo->Flags.Info.MediaCompressed  = 0;
        }

    }                                            // CCS
    else if(pTexInfo->Flags.Gpu.SeparateStencil) // ##########################
    {
        // Seperate stencil sizing is based on the associated depth buffer
        // size, however UMD manages this sizing, and GMM will allocate any
        // arbitrarily sized stencil. Stencils do have specific tiling
        // requirements however, which is handled below.

        if((pTexInfo->BaseWidth > 0) &&
           (pTexInfo->BaseHeight > 0))
        {
            __GMM_ASSERT(pTexInfo->BitsPerPixel == 8);

            if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) < IGFX_GEN7_CORE)
            {
                GMM_ASSERTDPF((pTexInfo->MaxLod == 0), "Stencil Buffer LOD's not supported!");
            }

            if(pGmmLibContext->GetSkuTable().FtrTileY)
            {
                // Separate Stencil Tile-W Gen8-Gen11, otherwise Tile-Y
                pTexInfo->Flags.Info.Linear  = 0;
                pTexInfo->Flags.Info.TiledX  = 0;
                pTexInfo->Flags.Info.TiledYf = 0;
                pTexInfo->Flags.Info.TiledW  = 0;
                GMM_SET_4KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
                GMM_SET_64KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);

                if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN8_CORE &&
                   GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) <= IGFX_GEN11_CORE)
                {
                    pTexInfo->Flags.Info.TiledW = 1;
                }
                else
                {
                    GMM_SET_4KB_TILE(pTexInfo->Flags, 1, pGmmLibContext);
                }
            }
            else
            {
                __GMM_ASSERT(pTexInfo->Flags.Info.Tile4 + pTexInfo->Flags.Info.Tile64 == 1);
            }
        }
        else
        {
            GMM_ASSERTDPF(0, "Illegal Separate Stencil creation parameters!");
            Status = GMM_ERROR;
        }
    } // Separate Stencil
    else if(pTexInfo->Flags.Gpu.MMC && pTexInfo->Flags.Gpu.UnifiedAuxSurface)
    {
        pTexInfo->Flags.Gpu.__NonMsaaLinearCCS = 1;
        pTexInfo->Flags.Info.Linear            = 1;
    }

    return Status;
}